

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# citylots_std.cpp
# Opt level: O0

ostream * operator<<(ostream *os,JSONValue *v)

{
  ostream *poVar1;
  JSONValue *v_local;
  ostream *os_local;
  
  switch(v->type) {
  case None:
    std::operator<<(os,"None");
    break;
  case Number:
    poVar1 = std::operator<<(os,"Number ");
    std::ostream::operator<<(poVar1,(v->field_1).dvalue);
    break;
  case String:
    poVar1 = std::operator<<(os,"String ");
    std::ostream::operator<<(poVar1,(v->field_1).svalue);
    break;
  case Boolean:
    poVar1 = std::operator<<(os,"Boolean ");
    std::ostream::operator<<(poVar1,(bool)((v->field_1).bvalue & 1));
    break;
  case List:
    poVar1 = std::operator<<(os,"List");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case Object:
    poVar1 = std::operator<<(os,"Object");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const JSONValue& v)
{
    switch (v.type)
    {
    case JSONType::None:
        os << "None";
        break;
    case JSONType::Number:
        os << "Number " << v.dvalue;
        break;
    case JSONType::String:
        os << "String " << v.svalue;
        break;
    case JSONType::Boolean:
        os << "Boolean " << v.bvalue;
        break;
    case JSONType::List:
        os << "List" << std::endl;
        break;
    case JSONType::Object:
        os << "Object" << std::endl;
        break;
    }
    return os;
}